

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_eval_edge_face_uv(REF_GRID ref_grid,REF_INT edge_geom)

{
  REF_DBL t;
  int iVar1;
  int iVar2;
  REF_INT *pRVar3;
  REF_ADJ pRVar4;
  REF_ADJ_ITEM pRVar5;
  REF_CELL pRVar6;
  REF_DBL *pRVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  int in_EDX;
  int iVar11;
  undefined8 uVar12;
  long lVar13;
  int iVar14;
  undefined4 in_register_00000034;
  REF_GEOM ref_geom;
  char *pcVar15;
  long lVar16;
  bool bVar17;
  double uv [2];
  REF_INT nodes [27];
  int local_bc;
  REF_DBL local_b8;
  REF_DBL RStack_b0;
  REF_DBL local_a8;
  undefined4 local_a0;
  int iStack_9c;
  
  ref_geom = (REF_GEOM)CONCAT44(in_register_00000034,edge_geom);
  uVar10 = 3;
  if ((-1 < in_EDX) && (in_EDX < ref_geom->max)) {
    pRVar3 = ref_geom->descr;
    uVar9 = in_EDX * 6;
    if (pRVar3[uVar9] == 1) {
      iVar1 = pRVar3[(ulong)uVar9 + 5];
      lVar16 = (long)iVar1;
      uVar10 = 0;
      if (-1 < lVar16) {
        pRVar4 = ref_geom->ref_adj;
        t = ref_geom->param[(uint)(in_EDX * 2)];
        if ((iVar1 < pRVar4->nnode) && (iVar14 = pRVar4->first[lVar16], iVar14 != -1)) {
          pRVar5 = pRVar4->item;
          bVar17 = false;
          do {
            while( true ) {
              if (pRVar3[(long)pRVar5[iVar14].ref * 6] == 2) break;
LAB_0013a44b:
              iVar14 = pRVar5[iVar14].next;
              if (iVar14 == -1) {
                if (!bVar17) {
                  if (iVar1 < 0) goto LAB_0013a590;
                  goto LAB_0013a4d8;
                }
                goto LAB_0013a457;
              }
            }
            if (!bVar17) {
              bVar17 = pRVar3[(long)pRVar5[iVar14].ref * 6 + 3] != 0;
              goto LAB_0013a44b;
            }
            iVar14 = pRVar5[iVar14].next;
            bVar17 = true;
          } while (iVar14 != -1);
LAB_0013a457:
          uVar10 = 0;
          if (((-1 < iVar1) && (pRVar6 = ref_grid->cell[6], iVar1 < (int)pRVar6->type)) &&
             (lVar13 = (long)*(int *)(*(long *)&pRVar6->size_per + lVar16 * 4), uVar10 = 0,
             lVar13 != -1)) {
            uVar10 = ref_cell_nodes((REF_CELL)ref_grid,
                                    *(REF_INT *)(*(long *)&pRVar6->edge_per + 4 + lVar13 * 8),
                                    (REF_INT *)&local_a8);
            iVar14 = iStack_9c;
            while (uVar10 == 0) {
              iStack_9c = iVar14;
              uVar10 = ref_geom_cell_tuv(ref_geom,iVar1,(REF_INT *)&local_a8,2,&local_b8,&local_bc);
              if (uVar10 != 0) {
                pcVar15 = "cell uv";
                uVar12 = 0x3a0;
                goto LAB_0013a5bd;
              }
              if (((local_bc == 1) && (-1 < iVar1)) &&
                 ((iVar1 < pRVar4->nnode && (iVar11 = pRVar4->first[lVar16], iVar11 != -1)))) {
                pRVar5 = pRVar4->item;
                pRVar3 = ref_geom->descr;
                do {
                  iVar2 = pRVar5[iVar11].ref;
                  if ((pRVar3[(long)iVar2 * 6] == 2) && (iVar14 == pRVar3[(int)(iVar2 * 6 | 1)])) {
                    pRVar7 = ref_geom->param;
                    pRVar7[(long)iVar2 * 2] = local_b8;
                    (pRVar7 + (long)iVar2 * 2)[1] = RStack_b0;
                  }
                  iVar11 = pRVar5[iVar11].next;
                } while (iVar11 != -1);
              }
              lVar8 = *(long *)&ref_grid->cell[6]->edge_per;
              lVar13 = (long)*(int *)(lVar8 + (long)(int)lVar13 * 8);
              if (lVar13 == -1) {
                return 0;
              }
              uVar10 = ref_cell_nodes((REF_CELL)ref_grid,*(REF_INT *)(lVar8 + 4 + lVar13 * 8),
                                      (REF_INT *)&local_a8);
              iVar14 = iStack_9c;
            }
            pcVar15 = "cell nodes";
            uVar12 = 0x39d;
LAB_0013a5bd:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   uVar12,"ref_geom_eval_edge_face_uv",(ulong)uVar10,pcVar15);
          }
        }
        else {
LAB_0013a4d8:
          uVar10 = 0;
          if ((iVar1 < pRVar4->nnode) && (lVar16 = (long)pRVar4->first[lVar16], lVar16 != -1)) {
            pRVar5 = pRVar4->item + lVar16;
            while( true ) {
              iVar1 = pRVar5->ref;
              pRVar3 = ref_geom->descr;
              if (pRVar3[(long)iVar1 * 6] == 2) {
                uVar10 = ref_egads_edge_face_uv
                                   (ref_geom,pRVar3[uVar9 | 1],pRVar3[(int)(iVar1 * 6 | 1)],0,t,
                                    &local_a8);
                if (uVar10 != 0) {
                  pcVar15 = "edge uv";
                  uVar12 = 0x3b2;
                  goto LAB_0013a5bd;
                }
                pRVar7 = ref_geom->param;
                pRVar7[(long)iVar1 * 2] = local_a8;
                pRVar7[iVar1 * 2 + 1] = (REF_DBL)CONCAT44(iStack_9c,local_a0);
              }
              lVar16 = (long)pRVar4->item[(int)lVar16].next;
              if (lVar16 == -1) break;
              pRVar5 = pRVar4->item + lVar16;
            }
LAB_0013a590:
            uVar10 = 0;
          }
        }
      }
    }
  }
  return uVar10;
}

Assistant:

REF_FCN static REF_STATUS ref_geom_eval_edge_face_uv(REF_GRID ref_grid,
                                                     REF_INT edge_geom) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_ADJ ref_adj = ref_geom_adj(ref_geom);
  REF_INT node, cell_item, geom_item, cell, face_geom;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  double t;
  double uv[2], edgeuv[2];
  int sense;
  REF_INT faceid;
  REF_BOOL have_jump;

  if (edge_geom < 0 || ref_geom_max(ref_geom) <= edge_geom) return REF_INVALID;
  if (REF_GEOM_EDGE != ref_geom_type(ref_geom, edge_geom)) return REF_INVALID;

  t = ref_geom_param(ref_geom, 0, edge_geom);
  node = ref_geom_node(ref_geom, edge_geom);

  have_jump = REF_FALSE;
  each_ref_adj_node_item_with_ref(ref_adj, node, geom_item, face_geom) {
    if (REF_GEOM_FACE == ref_geom_type(ref_geom, face_geom)) {
      have_jump = have_jump || (0 != ref_geom_jump(ref_geom, face_geom));
    }
  }

  if (have_jump) {
    /* uv update at jump not needed, should always depend on cell_c2n */
    /* keeping for consistency with non-jump */
    each_ref_cell_having_node(ref_cell, node, cell_item, cell) {
      RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
      faceid = nodes[3];
      RSS(ref_geom_cell_tuv(ref_geom, node, nodes, REF_GEOM_FACE, uv, &sense),
          "cell uv");
      if (1 == sense) { /* sense to use is arbitrary */
        each_ref_adj_node_item_with_ref(ref_adj, node, geom_item, face_geom) {
          if (REF_GEOM_FACE == ref_geom_type(ref_geom, face_geom) &&
              faceid == ref_geom_id(ref_geom, face_geom)) {
            ref_geom_param(ref_geom, 0, face_geom) = uv[0];
            ref_geom_param(ref_geom, 1, face_geom) = uv[1];
          }
        }
      }
    }
  } else {
    each_ref_adj_node_item_with_ref(ref_adj, node, geom_item, face_geom) {
      if (REF_GEOM_FACE == ref_geom_type(ref_geom, face_geom)) {
        faceid = ref_geom_id(ref_geom, face_geom);
        sense = 0;
        RSS(ref_egads_edge_face_uv(ref_geom, ref_geom_id(ref_geom, edge_geom),
                                   faceid, sense, t, edgeuv),
            "edge uv");
        ref_geom_param(ref_geom, 0, face_geom) = edgeuv[0];
        ref_geom_param(ref_geom, 1, face_geom) = edgeuv[1];
      }
    }
  }

  return REF_SUCCESS;
}